

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::IOEffect::Encode(IOEffect *this,KDataStream *stream)

{
  StandardVariable::Encode(&this->super_StandardVariable,stream);
  KDataStream::Write(stream,(this->super_StandardVariable).field_0xe);
  KDataStream::Write(stream,(this->super_StandardVariable).field_0xf);
  KDataStream::Write(stream,this->m_ui8Eff);
  KDataStream::Write(stream,this->m_ui8EffDtyCyc);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16EffDur);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Proc);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  return;
}

Assistant:

void IOEffect::Encode( KDataStream & stream ) const
{
    StandardVariable::Encode( stream );

    stream << m_ui8Status
           << m_ui8LnkTyp
           << m_ui8Eff
           << m_ui8EffDtyCyc
           << m_ui16EffDur
           << m_ui16Proc
           << m_ui16Padding;
}